

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O0

void leb__HeapWrite_BitField(leb_Heap *leb,leb_Node node,uint32_t bitValue)

{
  uint32_t uVar1;
  uint32_t bitID;
  uint32_t bitValue_local;
  leb_Heap *leb_local;
  leb_Node node_local;
  
  uVar1 = leb__NodeBitID_BitField(leb,node);
  leb__SetBitValue(leb->buffer + (uVar1 >> 5),uVar1 & 0x1f,bitValue);
  return;
}

Assistant:

static void
leb__HeapWrite_BitField(
    leb_Heap *leb,
    const leb_Node node,
    const uint32_t bitValue
) {
    uint32_t bitID = leb__NodeBitID_BitField(leb, node);

    leb__SetBitValue(&leb->buffer[bitID >> 5u], bitID & 31u, bitValue);
}